

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver_strategies.cpp
# Opt level: O0

uint32 __thiscall Clasp::ReduceParams::prepare(ReduceParams *this,bool withLookback)

{
  bool bVar1;
  float *pfVar2;
  byte in_SIL;
  ReduceParams *in_RDI;
  float fVar3;
  ScheduleStrategy SVar4;
  double in_stack_ffffffffffffffc8;
  undefined8 local_24;
  undefined8 local_1c;
  ReduceParams *this_00;
  
  this_00 = in_RDI;
  if ((in_SIL & 1) != 0) {
    fVar3 = fReduce(in_RDI);
    if ((fVar3 != 0.0) || (NAN(fVar3))) {
      bVar1 = ScheduleStrategy::defaulted(&in_RDI->cflSched);
      if ((bVar1) &&
         ((bVar1 = ScheduleStrategy::disabled(&in_RDI->growSched), bVar1 &&
          (bVar1 = ScheduleStrategy::defaulted(&in_RDI->growSched), !bVar1)))) {
        SVar4 = ScheduleStrategy::arith((uint32)((ulong)in_RDI >> 0x20),in_stack_ffffffffffffffc8,0)
        ;
        local_24 = SVar4._0_8_;
        *(undefined8 *)&in_RDI->cflSched = local_24;
        local_1c = SVar4._8_8_;
        (in_RDI->cflSched).len = (undefined4)local_1c;
        (in_RDI->cflSched).grow = (float)local_1c._4_4_;
      }
      if ((in_RDI->fMax == 0.0) && (!NAN(in_RDI->fMax))) {
        return 0;
      }
      pfVar2 = std::max<float>(&in_RDI->fMax,&in_RDI->fInit);
      in_RDI->fMax = *pfVar2;
      return 0;
    }
  }
  disable(this_00);
  return 0;
}

Assistant:

uint32 ReduceParams::prepare(bool withLookback) {
	if (!withLookback || fReduce() == 0.0f) {
		disable();
		return 0;
	}
	if (cflSched.defaulted() && growSched.disabled() && !growSched.defaulted()) {
		cflSched = ScheduleStrategy::arith(4000, 600);
	}
	if (fMax != 0.0f) { fMax = std::max(fMax, fInit); }
	return 0;
}